

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O3

void __thiscall
CLIntercept::getTimingTagBlocking
          (CLIntercept *this,char *functionName,cl_bool blocking,size_t size,string *hostTag,
          string *deviceTag)

{
  char *pcVar1;
  char s [256];
  char local_138 [264];
  
  std::__cxx11::string::reserve((ulong)deviceTag);
  pcVar1 = (char *)deviceTag->_M_string_length;
  strlen(functionName);
  std::__cxx11::string::_M_replace((ulong)deviceTag,0,pcVar1,(ulong)functionName);
  if ((size != 0) && ((this->m_Config).DevicePerformanceTimeTransferTracking == true)) {
    snprintf(local_138,0x100,"( %zu bytes )",size);
    std::__cxx11::string::append((char *)deviceTag);
  }
  if (blocking == 1) {
    std::__cxx11::string::append((char *)hostTag);
  }
  return;
}

Assistant:

void CLIntercept::getTimingTagBlocking(
    const char* functionName,
    const cl_bool blocking,
    const size_t size,
    std::string& hostTag,
    std::string& deviceTag )
{
    deviceTag.reserve(128);
    deviceTag = functionName;

    if( size && config().DevicePerformanceTimeTransferTracking )
    {
        char    s[256];
        CLI_SPRINTF( s, 256, "( %zu bytes )", size );
        deviceTag += s;
    }

    if( blocking == CL_TRUE )
    {
        hostTag += "blocking";
    }
}